

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_list.cpp
# Opt level: O2

bool __thiscall
Am_Priority_List::Two_List_Get_Next
          (Am_Priority_List *this,Am_Priority_List *other_list,Am_Object *inter,float *priority)

{
  float fVar1;
  float fVar2;
  Am_Priority_List_Item *pAVar3;
  Am_Priority_List_Item *pAVar4;
  Am_Priority_List_Item **ppAVar5;
  
  pAVar4 = this->current;
  if (pAVar4 == (Am_Priority_List_Item *)0x0) {
    if ((other_list == (Am_Priority_List *)0x0) ||
       (pAVar3 = other_list->current, pAVar3 == (Am_Priority_List_Item *)0x0)) {
      return false;
    }
  }
  else {
    ppAVar5 = &this->current;
    if ((other_list == (Am_Priority_List *)0x0) ||
       (pAVar3 = other_list->current, pAVar3 == (Am_Priority_List_Item *)0x0)) goto LAB_0022d78c;
    fVar1 = pAVar3->main_priority;
    fVar2 = pAVar4->main_priority;
    if ((fVar1 < fVar2) ||
       (((fVar1 == fVar2 && (!NAN(fVar1) && !NAN(fVar2))) &&
        ((pAVar3->second_priority < pAVar4->second_priority ||
         ((pAVar3->second_priority == pAVar4->second_priority &&
          (pAVar3->third_priority <= pAVar4->third_priority)))))))) goto LAB_0022d78c;
  }
  ppAVar5 = &other_list->current;
  pAVar4 = pAVar3;
LAB_0022d78c:
  Am_Object::operator=(inter,&pAVar4->obj);
  pAVar4 = *ppAVar5;
  *priority = pAVar4->main_priority;
  *ppAVar5 = pAVar4->next;
  return true;
}

Assistant:

bool
Am_Priority_List::Two_List_Get_Next(Am_Priority_List *other_list,
                                    Am_Object &inter, float &priority)
{
  if (current) {
    if (other_list && other_list->current) {
      //then have to check the priorities
      if (other_list->current->main_priority < current->main_priority ||
          (other_list->current->main_priority == current->main_priority &&
           (other_list->current->second_priority < current->second_priority ||
            (other_list->current->second_priority == current->second_priority &&
             other_list->current->third_priority <=
                 current->third_priority)))) {
        //then other is lower, I am higher
        inter = current->obj;
        priority = current->main_priority;
        current = current->next;
      } else { //other is higher
        inter = other_list->current->obj;
        priority = other_list->current->main_priority;
        other_list->current = other_list->current->next;
      }
    } else { // current but not other current, return my next item
      inter = current->obj;
      priority = current->main_priority;
      current = current->next;
    }
  } else { // not current
    if (other_list && other_list->current) {
      inter = other_list->current->obj;
      priority = other_list->current->main_priority;
      other_list->current = other_list->current->next;
    } else // neither has current value
      return false;
  }
  //if get here, then OK
  return true;
}